

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O0

void WebPBlendAlpha(WebPPicture *picture,uint32_t background_rgb)

{
  byte bVar1;
  int iVar2;
  uint r_00;
  uint g_00;
  uint b_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint in_ESI;
  int *in_RDI;
  int b;
  int g;
  int r;
  int alpha_3;
  uint32_t background;
  uint32_t *argb;
  uint32_t alpha_2;
  uint32_t alpha_1;
  uint8_t *a_ptr2;
  uint8_t alpha;
  uint8_t *a_ptr;
  uint8_t *v_ptr;
  uint8_t *u_ptr;
  uint8_t *y_ptr;
  int has_alpha;
  int V0;
  int U0;
  int Y0;
  int uv_width;
  int y;
  int x;
  int blue;
  int green;
  int red;
  undefined8 in_stack_ffffffffffffff68;
  void *pvVar10;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  long local_78;
  void *local_58;
  long local_50;
  long local_48;
  long local_40;
  uint local_20;
  int local_1c;
  
  r_00 = in_ESI >> 0x10 & 0xff;
  g_00 = in_ESI >> 8 & 0xff;
  b_00 = in_ESI & 0xff;
  if (in_RDI != (int *)0x0) {
    if (*in_RDI == 0) {
      iVar2 = in_RDI[2];
      iVar3 = VP8RGBToY(r_00,g_00,b_00,0x8000);
      iVar4 = VP8RGBToU(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68);
      iVar5 = VP8RGBToV(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (int)in_stack_ffffffffffffff68);
      local_40 = *(long *)(in_RDI + 4);
      local_48 = *(long *)(in_RDI + 6);
      local_50 = *(long *)(in_RDI + 8);
      local_58 = *(void **)(in_RDI + 0xc);
      if (((in_RDI[1] & 4U) != 0) && (local_58 != (void *)0x0)) {
        for (local_20 = 0; (int)local_20 < in_RDI[3]; local_20 = local_20 + 1) {
          for (local_1c = 0; local_1c < in_RDI[2]; local_1c = local_1c + 1) {
            bVar1 = *(byte *)((long)local_58 + (long)local_1c);
            if (bVar1 != 0xff) {
              *(char *)(local_40 + local_1c) =
                   (char)((iVar3 * (0xff - (uint)bVar1) +
                          (uint)*(byte *)(local_40 + local_1c) * (uint)bVar1) * 0x101 + 0x100 >>
                         0x10);
            }
          }
          if ((local_20 & 1) == 0) {
            pvVar10 = local_58;
            if (local_20 + 1 != in_RDI[3]) {
              pvVar10 = (void *)((long)local_58 + (long)in_RDI[0xe]);
            }
            for (local_1c = 0; local_1c < iVar2 >> 1; local_1c = local_1c + 1) {
              iVar6 = (uint)*(byte *)((long)local_58 + (long)(local_1c << 1)) +
                      (uint)*(byte *)((long)local_58 + (long)(local_1c * 2 + 1)) +
                      (uint)*(byte *)((long)pvVar10 + (long)(local_1c << 1)) +
                      (uint)*(byte *)((long)pvVar10 + (long)(local_1c * 2 + 1));
              *(char *)(local_48 + local_1c) =
                   (char)((iVar4 * (0x3fc - iVar6) + (uint)*(byte *)(local_48 + local_1c) * iVar6) *
                          0x101 + 0x400 >> 0x12);
              *(char *)(local_50 + local_1c) =
                   (char)((iVar5 * (0x3fc - iVar6) + (uint)*(byte *)(local_50 + local_1c) * iVar6) *
                          0x101 + 0x400 >> 0x12);
            }
            if ((in_RDI[2] & 1U) != 0) {
              iVar6 = (uint)*(byte *)((long)local_58 + (long)(local_1c << 1)) +
                      (uint)*(byte *)((long)pvVar10 + (long)(local_1c << 1));
              *(char *)(local_48 + local_1c) =
                   (char)((iVar4 * (iVar6 * -2 + 0x3fc) +
                          (uint)*(byte *)(local_48 + local_1c) * iVar6 * 2) * 0x101 + 0x400 >> 0x12)
              ;
              *(char *)(local_50 + local_1c) =
                   (char)((iVar5 * (iVar6 * -2 + 0x3fc) +
                          (uint)*(byte *)(local_50 + local_1c) * iVar6 * 2) * 0x101 + 0x400 >> 0x12)
              ;
            }
          }
          else {
            local_48 = local_48 + in_RDI[0xb];
            local_50 = local_50 + in_RDI[0xb];
          }
          memset(local_58,0xff,(long)in_RDI[2]);
          local_58 = (void *)((long)local_58 + (long)in_RDI[0xe]);
          local_40 = local_40 + in_RDI[10];
        }
      }
    }
    else {
      local_78 = *(long *)(in_RDI + 0x12);
      uVar7 = MakeARGB32(r_00,g_00,b_00);
      for (local_20 = 0; (int)local_20 < in_RDI[3]; local_20 = local_20 + 1) {
        for (local_1c = 0; local_1c < in_RDI[2]; local_1c = local_1c + 1) {
          uVar8 = *(uint *)(local_78 + (long)local_1c * 4) >> 0x18;
          if (uVar8 != 0xff) {
            if (uVar8 == 0) {
              *(uint32_t *)(local_78 + (long)local_1c * 4) = uVar7;
            }
            else {
              uVar9 = MakeARGB32((int)((r_00 * (0xff - uVar8) +
                                       (*(uint *)(local_78 + (long)local_1c * 4) >> 0x10 & 0xff) *
                                       uVar8) * 0x101 + 0x100) >> 0x10,
                                 (int)((g_00 * (0xff - uVar8) +
                                       (*(uint *)(local_78 + (long)local_1c * 4) >> 8 & 0xff) *
                                       uVar8) * 0x101 + 0x100) >> 0x10,
                                 (int)((b_00 * (0xff - uVar8) +
                                       (*(uint *)(local_78 + (long)local_1c * 4) & 0xff) * uVar8) *
                                       0x101 + 0x100) >> 0x10);
              *(uint32_t *)(local_78 + (long)local_1c * 4) = uVar9;
            }
          }
        }
        local_78 = local_78 + (long)in_RDI[0x14] * 4;
      }
    }
  }
  return;
}

Assistant:

void WebPBlendAlpha(WebPPicture* picture, uint32_t background_rgb) {
  const int red = (background_rgb >> 16) & 0xff;
  const int green = (background_rgb >> 8) & 0xff;
  const int blue = (background_rgb >> 0) & 0xff;
  int x, y;
  if (picture == NULL) return;
  if (!picture->use_argb) {
    // omit last pixel during u/v loop
    const int uv_width = (picture->width >> 1);
    const int Y0 = VP8RGBToY(red, green, blue, YUV_HALF);
    // VP8RGBToU/V expects the u/v values summed over four pixels
    const int U0 = VP8RGBToU(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int V0 = VP8RGBToV(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int has_alpha = picture->colorspace & WEBP_CSP_ALPHA_BIT;
    uint8_t* y_ptr = picture->y;
    uint8_t* u_ptr = picture->u;
    uint8_t* v_ptr = picture->v;
    uint8_t* a_ptr = picture->a;
    if (!has_alpha || a_ptr == NULL) return;    // nothing to do
    for (y = 0; y < picture->height; ++y) {
      // Luma blending
      for (x = 0; x < picture->width; ++x) {
        const uint8_t alpha = a_ptr[x];
        if (alpha < 0xff) {
          y_ptr[x] = BLEND(Y0, y_ptr[x], alpha);
        }
      }
      // Chroma blending every even line
      if ((y & 1) == 0) {
        uint8_t* const a_ptr2 =
            (y + 1 == picture->height) ? a_ptr : a_ptr + picture->a_stride;
        for (x = 0; x < uv_width; ++x) {
          // Average four alpha values into a single blending weight.
          // TODO(skal): might lead to visible contouring. Can we do better?
          const uint32_t alpha =
              a_ptr[2 * x + 0] + a_ptr[2 * x + 1] +
              a_ptr2[2 * x + 0] + a_ptr2[2 * x + 1];
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
        if (picture->width & 1) {  // rightmost pixel
          const uint32_t alpha = 2 * (a_ptr[2 * x + 0] + a_ptr2[2 * x + 0]);
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
      } else {
        u_ptr += picture->uv_stride;
        v_ptr += picture->uv_stride;
      }
      memset(a_ptr, 0xff, picture->width);  // reset alpha value to opaque
      a_ptr += picture->a_stride;
      y_ptr += picture->y_stride;
    }
  } else {
    uint32_t* argb = picture->argb;
    const uint32_t background = MakeARGB32(red, green, blue);
    for (y = 0; y < picture->height; ++y) {
      for (x = 0; x < picture->width; ++x) {
        const int alpha = (argb[x] >> 24) & 0xff;
        if (alpha != 0xff) {
          if (alpha > 0) {
            int r = (argb[x] >> 16) & 0xff;
            int g = (argb[x] >>  8) & 0xff;
            int b = (argb[x] >>  0) & 0xff;
            r = BLEND(red, r, alpha);
            g = BLEND(green, g, alpha);
            b = BLEND(blue, b, alpha);
            argb[x] = MakeARGB32(r, g, b);
          } else {
            argb[x] = background;
          }
        }
      }
      argb += picture->argb_stride;
    }
  }
}